

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSetISRFuncEx(uint gpio,uint edge,int timeout,gpioAlertFuncEx_t f,void *userdata)

{
  FILE *pFVar1;
  int iVar2;
  char *__format;
  ulong uVar3;
  
  pFVar1 = _stderr;
  uVar3 = (ulong)edge;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d edge=%d timeout=%d function=%08X userdata=%08X\n",
            myTimeStamp::buf,"gpioSetISRFuncEx",(ulong)gpio,uVar3,(ulong)(uint)timeout,f,userdata);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioSetISRFuncEx");
    }
  }
  else {
    if (gpio < 0x36) {
      if (edge < 3) {
        iVar2 = intGpioSetISRFunc(gpio,edge,timeout,f,1,userdata);
        return iVar2;
      }
      iVar2 = -0x7a;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x7a;
      }
      myTimeStamp();
      __format = "%s %s: bad ISR edge (%d)\n";
    }
    else {
      iVar2 = -3;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -3;
      }
      myTimeStamp();
      __format = "%s %s: bad gpio (%d)\n";
      uVar3 = (ulong)gpio;
    }
    fprintf(pFVar1,__format,myTimeStamp::buf,"gpioSetISRFuncEx",uVar3);
  }
  return iVar2;
}

Assistant:

int gpioSetISRFuncEx(
   unsigned gpio,
   unsigned edge,
   int timeout,
   gpioAlertFuncEx_t f,
   void *userdata)
{
   DBG(DBG_USER, "gpio=%d edge=%d timeout=%d function=%08X userdata=%08X",
      gpio, edge, timeout, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (gpio > PI_MAX_GPIO)
      SOFT_ERROR(PI_BAD_GPIO, "bad gpio (%d)", gpio);

   if (edge > EITHER_EDGE)
      SOFT_ERROR(PI_BAD_EDGE, "bad ISR edge (%d)", edge);

   return intGpioSetISRFunc(gpio, edge, timeout, f, 1, userdata);
}